

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

bool __thiscall
QFSFileEnginePrivate::nativeOpenImpl(QFSFileEnginePrivate *this,OpenMode openMode,mode_t mode)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  QAbstractFileEngine *this_00;
  int *piVar4;
  __off64_t _Var5;
  undefined4 in_ESI;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  off64_t ret;
  int flags;
  QFSFileEngine *q;
  mode_t in_stack_ffffffffffffff18;
  OpenModeFlag in_stack_ffffffffffffff1c;
  QString *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  FileError in_stack_ffffffffffffff2c;
  QAbstractFileEngine *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> mode_00;
  bool local_81;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_4c;
  undefined4 local_14;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_10;
  undefined4 local_c;
  long local_8;
  
  mode_00.i = (Int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  this_00 = &q_func(in_RDI)->super_QAbstractFileEngine;
  local_10.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
       (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
       QFlags<QIODeviceBase::OpenModeFlag>::operator&
                 ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff20,
                  in_stack_ffffffffffffff1c);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_10);
  if (bVar1) {
    local_14 = local_c;
    uVar2 = openModeToOpenFlags((OpenMode)mode_00.i);
    do {
      QFileSystemEntry::nativeFilePath
                ((QFileSystemEntry *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      QByteArray::constData((QByteArray *)0x214ac0);
      iVar3 = qt_safe_open((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                           in_stack_ffffffffffffff18);
      in_RDI->fd = iVar3;
      QByteArray::~QByteArray((QByteArray *)0x214aea);
      bVar1 = false;
      if (in_RDI->fd == -1) {
        piVar4 = __errno_location();
        bVar1 = *piVar4 == 4;
      }
    } while (bVar1);
    if (in_RDI->fd == -1) {
      __errno_location();
      __errno_location();
      qt_error_string(in_stack_ffffffffffffff2c);
      QAbstractFileEngine::setError
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
      QString::~QString((QString *)0x214b7f);
      local_81 = false;
      goto LAB_00214d26;
    }
    local_4c.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff20,
                    in_stack_ffffffffffffff1c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_4c);
    if (((((bVar1 ^ 0xffU) & 1) != 0) &&
        (bVar1 = QFileSystemEngine::fillMetaData
                           ((int)((ulong)in_RDI >> 0x20),
                            (QFileSystemMetaData *)
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)), bVar1))
       && (bVar1 = QFileSystemMetaData::isDirectory((QFileSystemMetaData *)0x214be2), bVar1)) {
      msgOpenDirectory();
      QAbstractFileEngine::setError(this_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
      iVar3 = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
      QString::~QString((QString *)0x214c23);
      qt_safe_close(iVar3);
      local_81 = false;
      goto LAB_00214d26;
    }
    if ((uVar2 & 4) != 0) {
      do {
        _Var5 = lseek64(in_RDI->fd,0,2);
        in_stack_ffffffffffffff2c = in_stack_ffffffffffffff2c & 0xffffff;
        if (_Var5 == -1) {
          piVar4 = __errno_location();
          in_stack_ffffffffffffff2c = CONCAT13(*piVar4 == 4,(int3)in_stack_ffffffffffffff2c);
        }
      } while ((char)(in_stack_ffffffffffffff2c >> 0x18) != '\0');
      if (_Var5 == -1) {
        __errno_location();
        __errno_location();
        qt_error_string(in_stack_ffffffffffffff2c);
        QAbstractFileEngine::setError
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,(QString *)this_00);
        QString::~QString((QString *)0x214cfc);
        local_81 = false;
        goto LAB_00214d26;
      }
    }
    in_RDI->fh = (FILE *)0x0;
  }
  in_RDI->closeFileHandle = true;
  local_81 = true;
LAB_00214d26:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_81;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEnginePrivate::nativeOpenImpl(QIODevice::OpenMode openMode, mode_t mode)
{
    Q_Q(QFSFileEngine);

    Q_ASSERT_X(openMode & QIODevice::Unbuffered, "QFSFileEngine::open",
               "QFSFileEngine no longer supports buffered mode; upper layer must buffer");
    if (openMode & QIODevice::Unbuffered) {
        int flags = openModeToOpenFlags(openMode);

        // Try to open the file in unbuffered mode.
        do {
            fd = QT_OPEN(fileEntry.nativeFilePath().constData(), flags, mode);
        } while (fd == -1 && errno == EINTR);

        // On failure, return and report the error.
        if (fd == -1) {
            q->setError(errno == EMFILE ? QFile::ResourceError : QFile::OpenError,
                        qt_error_string(errno));
            return false;
        }

        if (!(openMode & QIODevice::WriteOnly)) {
            // we don't need this check if we tried to open for writing because then
            // we had received EISDIR anyway.
            if (QFileSystemEngine::fillMetaData(fd, metaData)
                    && metaData.isDirectory()) {
                q->setError(QFile::OpenError, msgOpenDirectory());
                QT_CLOSE(fd);
                return false;
            }
        }

        // Seek to the end when in Append mode.
        if (flags & QFile::Append) {
            QT_OFF_T ret;
            do {
                ret = QT_LSEEK(fd, 0, SEEK_END);
            } while (ret == -1 && errno == EINTR);

            if (ret == -1) {
                q->setError(errno == EMFILE ? QFile::ResourceError : QFile::OpenError,
                            qt_error_string(errno));
                return false;
            }
        }

        fh = nullptr;
    }

    closeFileHandle = true;
    return true;
}